

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sub.c
# Opt level: O0

int nng_sub0_ctx_unsubscribe(nng_ctx id,void *buf,size_t sz)

{
  nni_proto_ctx_ops *pnVar1;
  sub0_ctx *ctx_00;
  sub0_ctx *ctx;
  nni_ctx *c;
  size_t sStack_20;
  int rv;
  size_t sz_local;
  void *buf_local;
  nng_ctx id_local;
  
  sStack_20 = sz;
  sz_local = (size_t)buf;
  buf_local._0_4_ = id.id;
  c._4_4_ = nni_ctx_find((nni_ctx **)&ctx,id.id);
  buf_local._4_4_ = c._4_4_;
  if (c._4_4_ == 0) {
    pnVar1 = nni_ctx_proto_ops((nni_ctx *)ctx);
    if (pnVar1->ctx_init == sub0_ctx_init) {
      ctx_00 = (sub0_ctx *)nni_ctx_proto_data((nni_ctx *)ctx);
      c._4_4_ = sub0_ctx_unsubscribe(ctx_00,(void *)sz_local,sStack_20);
      nni_ctx_rele((nni_ctx *)ctx);
      buf_local._4_4_ = c._4_4_;
    }
    else {
      nni_ctx_rele((nni_ctx *)ctx);
      buf_local._4_4_ = 9;
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
nng_sub0_ctx_unsubscribe(nng_ctx id, const void *buf, size_t sz)
{
	int       rv;
	nni_ctx  *c;
	sub0_ctx *ctx;

	if ((rv = nni_ctx_find(&c, id.id)) != 0) {
		return (rv);
	}
	// validate the socket type
	if (nni_ctx_proto_ops(c)->ctx_init != sub0_ctx_init) {
		nni_ctx_rele(c);
		return (NNG_ENOTSUP);
	}
	ctx = nni_ctx_proto_data(c);
	rv  = sub0_ctx_unsubscribe(ctx, buf, sz);
	nni_ctx_rele(c);
	return (rv);
}